

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O3

Dec_Graph_t * Abc_NodeMffcSingleNode(Abc_ManRst_t *p,Vec_Int_t *vSims,int nNodes,Vec_Int_t *vOnes)

{
  Vec_Ptr_t *pVVar1;
  ulong uVar2;
  Dec_Graph_t *pDVar3;
  Dec_Node_t *pDVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  Dec_Edge_t DVar11;
  uint uVar12;
  Dec_Edge_t DVar13;
  
  if ((long)vSims->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  uVar2 = (ulong)vOnes->nSize;
  if (0 < (long)uVar2) {
    lVar6 = 0;
    uVar7 = uVar2;
    uVar9 = 0;
    do {
      uVar8 = uVar9 + 1;
      if (uVar8 < uVar2) {
        uVar12 = vOnes->pArray[uVar9];
        uVar9 = 1;
        do {
          uVar10 = *(uint *)((long)vOnes->pArray + uVar9 * 4 + lVar6);
          if (((uVar10 | uVar12) ^ vSims->pArray[(long)vSims->nSize + -1]) == 0xffffffff) {
            uVar12 = uVar12 & 0x7fffffff;
            pDVar3 = (Dec_Graph_t *)calloc(1,0x20);
            pDVar3->nLeaves = 2;
            pDVar3->nCap = 0x36;
            pDVar4 = (Dec_Node_t *)malloc(0x510);
            pDVar3->pNodes = pDVar4;
            pDVar4->eEdge0 = (Dec_Edge_t)0x0;
            pDVar4->eEdge1 = (Dec_Edge_t)0x0;
            (pDVar4->field_2).pFunc = (void *)0x0;
            *(undefined8 *)&pDVar4->field_0x10 = 0;
            pDVar4[1].eEdge0 = (Dec_Edge_t)0x0;
            pDVar4[1].eEdge1 = (Dec_Edge_t)0x0;
            pDVar4[1].field_2.pFunc = (void *)0x0;
            *(undefined8 *)&pDVar4[1].field_0x10 = 0;
            pVVar1 = p->vDecs;
            uVar5 = uVar12 >> 1;
            if ((int)uVar5 < pVVar1->nSize) {
              uVar10 = uVar10 & 0x7fffffff;
              pDVar4->field_2 =
                   *(anon_union_8_2_00c7e208_for_Dec_Node_t__2 *)(pVVar1->pArray + uVar5);
              uVar5 = uVar10 >> 1;
              if ((int)uVar5 < pVVar1->nSize) {
                DVar13 = (Dec_Edge_t)(uVar12 ^ 1);
                DVar11 = (Dec_Edge_t)(uVar10 ^ 1);
                pDVar4[1].field_2 =
                     *(anon_union_8_2_00c7e208_for_Dec_Node_t__2 *)(pVVar1->pArray + uVar5);
                pDVar3->nSize = 3;
                pDVar4[2].field_2.pFunc = (void *)0x0;
                *(undefined8 *)&pDVar4[2].field_0x10 = 0;
                pDVar4[2].eEdge0 = DVar13;
                pDVar4[2].eEdge1 = DVar11;
                *(uint *)&pDVar4[2].field_0x10 =
                     ((uint)DVar11 & 1) << 0x10 | ((uint)DVar13 & 1) << 0xf;
                pDVar3->eRoot = (Dec_Edge_t)0x4;
                return pDVar3;
              }
            }
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      lVar6 = lVar6 + 4;
      uVar7 = uVar7 - 1;
      uVar9 = uVar8;
    } while (uVar8 != uVar2);
  }
  return (Dec_Graph_t *)0x0;
}

Assistant:

Dec_Graph_t * Abc_NodeMffcSingleNode( Abc_ManRst_t * p, Vec_Int_t * vSims, int nNodes, Vec_Int_t * vOnes )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eNode0, eNode1, eRoot;
    unsigned uRoot;
    int i, k;
    uRoot = (unsigned)Vec_IntEntryLast( vSims );
    for ( i = 0; i < vOnes->nSize; i++ )
        for ( k = i+1; k < vOnes->nSize; k++ )
            if ( ~uRoot == ((unsigned)vOnes->pArray[i] | (unsigned)vOnes->pArray[k]) )
            {
                eNode0 = Dec_IntToEdge( vOnes->pArray[i] ^ 1 );
                eNode1 = Dec_IntToEdge( vOnes->pArray[k] ^ 1 );
                pGraph = Dec_GraphCreate( 2 );
                Dec_GraphNode( pGraph, 0 )->pFunc = Vec_PtrEntry( p->vDecs, eNode0.Node );
                Dec_GraphNode( pGraph, 1 )->pFunc = Vec_PtrEntry( p->vDecs, eNode1.Node );
                eRoot = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
                Dec_GraphSetRoot( pGraph, eRoot );
                if ( Abc_NodeCheckFull( p, pGraph ) )
                    return pGraph;
                Dec_GraphFree( pGraph );
            }
    return NULL;
}